

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowSizeLimits
               (GLFWwindow *handle,int minwidth,int minheight,int maxwidth,int maxheight)

{
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  _GLFWwindow *window;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (((in_ESI == 0xffffffff) || (in_EDX == 0xffffffff)) ||
          ((-1 < (int)in_ESI && (-1 < (int)in_EDX)))) {
    if (((in_ECX == 0xffffffff) || (in_R8D == 0xffffffff)) ||
       ((-1 < (int)in_ECX &&
        (((-1 < (int)in_R8D && ((int)in_ESI <= (int)in_ECX)) && ((int)in_EDX <= (int)in_R8D)))))) {
      *(uint *)(in_RDI + 0x58) = in_ESI;
      *(uint *)(in_RDI + 0x5c) = in_EDX;
      *(uint *)(in_RDI + 0x60) = in_ECX;
      *(uint *)(in_RDI + 100) = in_R8D;
      if ((*(long *)(in_RDI + 0x48) == 0) && (*(int *)(in_RDI + 8) != 0)) {
        _glfwPlatformSetWindowSizeLimits
                  ((_GLFWwindow *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,(int)((ulong)in_RDI >> 0x20)
                   ,(int)in_RDI);
      }
    }
    else {
      _glfwInputError(0x10004,"Invalid window maximum size %ix%i",(ulong)in_ECX,(ulong)in_R8D);
    }
  }
  else {
    _glfwInputError(0x10004,"Invalid window minimum size %ix%i",(ulong)in_ESI,(ulong)in_EDX);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowSizeLimits(GLFWwindow* handle,
                                     int minwidth, int minheight,
                                     int maxwidth, int maxheight)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (minwidth != GLFW_DONT_CARE && minheight != GLFW_DONT_CARE)
    {
        if (minwidth < 0 || minheight < 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window minimum size %ix%i",
                            minwidth, minheight);
            return;
        }
    }

    if (maxwidth != GLFW_DONT_CARE && maxheight != GLFW_DONT_CARE)
    {
        if (maxwidth < 0 || maxheight < 0 ||
            maxwidth < minwidth || maxheight < minheight)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window maximum size %ix%i",
                            maxwidth, maxheight);
            return;
        }
    }

    window->minwidth  = minwidth;
    window->minheight = minheight;
    window->maxwidth  = maxwidth;
    window->maxheight = maxheight;

    if (window->monitor || !window->resizable)
        return;

    _glfwPlatformSetWindowSizeLimits(window,
                                     minwidth, minheight,
                                     maxwidth, maxheight);
}